

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O3

int ixxx::posix::connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  connect_error *this;
  int *piVar2;
  
  iVar1 = ::connect(__fd,__addr,__len);
  if (iVar1 != -1) {
    return iVar1;
  }
  this = (connect_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  connect_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
  __cxa_throw(this,&connect_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

int connect(int sockfd, const struct sockaddr *addr, socklen_t addrlen)
    {
      int r = ::connect(sockfd, addr, addrlen);
      if (r == -1)
        throw connect_error(errno);
      return r;
    }